

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_arg_id(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *this,int id)

{
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>::check_arg_id
            (&this->parse_context,id);
  get_arg(this,id);
  return;
}

Assistant:

void on_arg_id(int id) {
    parse_context.check_arg_id(id);
    get_arg(id);
  }